

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall cmGeneratorTarget::GetExportMacro_abi_cxx11_(cmGeneratorTarget *this)

{
  bool bVar1;
  TargetType TVar2;
  string *psVar3;
  string local_98;
  undefined1 local_78 [8];
  string in;
  allocator<char> local_41;
  string local_40;
  cmValue local_20;
  cmValue custom_export_name;
  cmGeneratorTarget *this_local;
  
  custom_export_name.Value = (string *)this;
  TVar2 = GetType(this);
  if (((TVar2 != SHARED_LIBRARY) && (TVar2 = GetType(this), TVar2 != MODULE_LIBRARY)) &&
     (bVar1 = IsExecutableWithExports(this), !bVar1)) {
    return (string *)0x0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"DEFINE_SYMBOL",&local_41);
  local_20 = GetProperty(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  bVar1 = cmValue::operator_cast_to_bool(&local_20);
  if (bVar1) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_20);
    std::__cxx11::string::operator=((string *)&this->ExportMacro,(string *)psVar3);
  }
  else {
    psVar3 = GetName_abi_cxx11_(this);
    cmStrCat<std::__cxx11::string_const&,char_const(&)[9]>
              ((string *)local_78,psVar3,(char (*) [9])0x109016b);
    cmsys::SystemTools::MakeCidentifier(&local_98,(string *)local_78);
    std::__cxx11::string::operator=((string *)&this->ExportMacro,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)local_78);
  }
  return &this->ExportMacro;
}

Assistant:

const std::string* cmGeneratorTarget::GetExportMacro() const
{
  // Define the symbol for targets that export symbols.
  if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
      this->GetType() == cmStateEnums::MODULE_LIBRARY ||
      this->IsExecutableWithExports()) {
    if (cmValue custom_export_name = this->GetProperty("DEFINE_SYMBOL")) {
      this->ExportMacro = *custom_export_name;
    } else {
      std::string in = cmStrCat(this->GetName(), "_EXPORTS");
      this->ExportMacro = cmSystemTools::MakeCidentifier(in);
    }
    return &this->ExportMacro;
  }
  return nullptr;
}